

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O3

void * sigfiddle_new(t_floatarg npoints,t_floatarg npitch,t_floatarg fnpeakanal,t_floatarg fnpeakout
                    )

{
  int iVar1;
  t_sigfiddle *x;
  t_symbol *ptVar2;
  _outlet *p_Var3;
  _clock *p_Var4;
  long lVar5;
  void **ppvVar6;
  
  x = (t_sigfiddle *)pd_new(sigfiddle_class);
  iVar1 = sigfiddle_doinit(x,(long)npoints,(long)npitch,(long)(int)fnpeakanal,(long)(int)fnpeakout);
  if (iVar1 == 0) {
    x->x_inbuf = (t_float *)0x0;
    pd_free((t_pd *)x);
    x = (t_sigfiddle *)0x0;
  }
  else {
    ptVar2 = gensym("float");
    p_Var3 = outlet_new((t_object *)x,ptVar2);
    x->x_noteout = p_Var3;
    ptVar2 = gensym("bang");
    p_Var3 = outlet_new((t_object *)x,ptVar2);
    x->x_attackout = p_Var3;
    if (0 < x->x_npitch) {
      ppvVar6 = &x->x_hist[0].h_outlet;
      lVar5 = 0;
      do {
        ptVar2 = gensym("list");
        p_Var3 = outlet_new((t_object *)x,ptVar2);
        *ppvVar6 = p_Var3;
        lVar5 = lVar5 + 1;
        ppvVar6 = ppvVar6 + 0x18;
      } while (lVar5 < x->x_npitch);
    }
    ptVar2 = gensym("float");
    p_Var3 = outlet_new((t_object *)x,ptVar2);
    x->x_envout = p_Var3;
    if (x->x_npeakout == 0) {
      p_Var3 = (_outlet *)0x0;
    }
    else {
      ptVar2 = gensym("list");
      p_Var3 = outlet_new((t_object *)x,ptVar2);
    }
    x->x_peakout = p_Var3;
    p_Var4 = clock_new(x,sigfiddle_bang);
    x->x_clock = p_Var4;
  }
  return x;
}

Assistant:

void *sigfiddle_new(t_floatarg npoints, t_floatarg npitch,
    t_floatarg fnpeakanal, t_floatarg fnpeakout)
{
    t_sigfiddle *x = (t_sigfiddle *)pd_new(sigfiddle_class);
    int i;
    int npeakanal = fnpeakanal, npeakout = fnpeakout;


    if (!sigfiddle_doinit(x, npoints, npitch,
        npeakanal, npeakout))
    {
        x->x_inbuf = 0;     /* prevent the free routine from cleaning up */
        pd_free(&x->x_ob.ob_pd);
        return (0);
    }
    x->x_noteout = outlet_new(&x->x_ob, gensym("float"));
    x->x_attackout = outlet_new(&x->x_ob, gensym("bang"));
    for (i = 0; i < x->x_npitch; i++)
        x->x_hist[i].h_outlet = outlet_new(&x->x_ob, gensym("list"));
    x->x_envout = outlet_new(&x->x_ob, gensym("float"));
    if (x->x_npeakout)
        x->x_peakout = outlet_new(&x->x_ob, gensym("list"));
    else x->x_peakout = 0;
    x->x_clock = clock_new(&x->x_ob.ob_pd, (t_method)sigfiddle_bang);
    return (x);
}